

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O0

REF_STATUS ref_layer_create(REF_LAYER *ref_layer_ptr,REF_MPI ref_mpi)

{
  REF_LAYER pRVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LAYER ref_layer;
  REF_MPI ref_mpi_local;
  REF_LAYER *ref_layer_ptr_local;
  
  pRVar1 = (REF_LAYER)malloc(0x18);
  *ref_layer_ptr = pRVar1;
  if (*ref_layer_ptr == (REF_LAYER)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x2b,
           "ref_layer_create","malloc *ref_layer_ptr of REF_LAYER_STRUCT NULL");
    ref_layer_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_layer_ptr;
    ref_layer_ptr_local._4_4_ = ref_list_create(&pRVar1->ref_list);
    if (ref_layer_ptr_local._4_4_ == 0) {
      ref_layer_ptr_local._4_4_ = ref_grid_create(&pRVar1->ref_grid,ref_mpi);
      if (ref_layer_ptr_local._4_4_ == 0) {
        pRVar1->nnode_per_layer = -1;
        pRVar1->verbose = 0;
        ref_layer_ptr_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x30,"ref_layer_create",(ulong)ref_layer_ptr_local._4_4_,"create grid");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x2f,
             "ref_layer_create",(ulong)ref_layer_ptr_local._4_4_,"create list");
    }
  }
  return ref_layer_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_layer_create(REF_LAYER *ref_layer_ptr, REF_MPI ref_mpi) {
  REF_LAYER ref_layer;

  ref_malloc(*ref_layer_ptr, 1, REF_LAYER_STRUCT);

  ref_layer = *ref_layer_ptr;

  RSS(ref_list_create(&(ref_layer_list(ref_layer))), "create list");
  RSS(ref_grid_create(&(ref_layer_grid(ref_layer)), ref_mpi), "create grid");

  ref_layer->nnode_per_layer = REF_EMPTY;
  ref_layer->verbose = REF_FALSE;

  return REF_SUCCESS;
}